

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O2

error __thiscall ldg::size(ldg *this,context *ctx,token *token,opcode *op)

{
  int iVar1;
  string_view prefix;
  optional<unsigned_long> oVar2;
  _Storage<unsigned_long,_true> _Stack_60;
  token local_58;
  
  prefix._M_str = ".";
  prefix._M_len = 1;
  oVar2 = find_in_table(token,size::table,prefix);
  _Stack_60._M_value =
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  if (((undefined1  [16])
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    _Stack_60._M_value = 4;
  }
  else {
    context::tokenize(&local_58,ctx);
    token->column = local_58.column;
    (token->data).string._M_str = local_58.data.string._M_str;
    token->type = local_58.type;
    token->line = local_58.line;
    token->filename = local_58.filename;
    (token->data).predicate = local_58.data.predicate;
    if (_Stack_60._M_value == 7) {
      iVar1 = equal(token,".128");
      if (iVar1 == 0) {
        fail((token *)this,(char *)token,size::msg);
        return (unique_ptr<char[],_std::default_delete<char[]>_>)
               (unique_ptr<char[],_std::default_delete<char[]>_>)this;
      }
      context::tokenize(&local_58,ctx);
      token->column = local_58.column;
      (token->data).string._M_str = local_58.data.string._M_str;
      token->type = local_58.type;
      token->line = local_58.line;
      token->filename = local_58.filename;
      (token->data).predicate = local_58.data.predicate;
      _Stack_60._M_value = 7;
    }
  }
  opcode::add_bits(op,_Stack_60._M_value << 0x30);
  *(undefined8 *)this = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(size)
    {
        static const char* table[] = {"U8", "S8", "U16", "S16", "32", "64", "128", "U"};
        static const char* msg = "expected .U8, .S8, .U16, .S16, .32, .64, .128 or .U.128";

        const std::optional result = find_in_table(token, table, ".");
        if (result) {
            token = ctx.tokenize();
            if (*result == 7) { // .U
                if (!equal(token, ".128")) {
                    return fail(token, msg);
                }
                token = ctx.tokenize();
            }
        }
        op.add_bits(result.value_or(4) << 48);
        return {};
    }